

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall I2sAnalyzerSettings::SetSettingsFromInterfaces(I2sAnalyzerSettings *this)

{
  char cVar1;
  bool bVar2;
  double dVar3;
  Channel data_channel;
  Channel frame_channel;
  Channel clock_channel;
  Channel aCStack_68 [16];
  Channel local_58 [16];
  Channel local_48 [16];
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_58,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator==(local_48,local_58);
  Channel::~Channel(local_58);
  if (cVar1 == '\0') {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(aCStack_68,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar1 = Channel::operator==(local_58,aCStack_68);
    Channel::~Channel(aCStack_68);
    if (cVar1 == '\0') {
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      cVar1 = Channel::operator==(aCStack_68,local_38);
      Channel::~Channel(local_38);
      if ((((cVar1 == '\0') && (cVar1 = Channel::operator==(local_48,local_58), cVar1 == '\0')) &&
          (cVar1 = Channel::operator==(local_48,aCStack_68), cVar1 == '\0')) &&
         (cVar1 = Channel::operator==(local_58,aCStack_68), cVar1 == '\0')) {
        Channel::operator=(&this->mClockChannel,local_48);
        Channel::operator=(&this->mFrameChannel,local_58);
        Channel::operator=(&this->mDataChannel,aCStack_68);
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mShiftOrder = (ShiftOrder)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mDataValidEdge = (EdgeDirection)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mBitsPerWord = (U32)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mWordAlignment = (PcmWordAlignment)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mFrameType = (PcmFrameType)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mBitAlignment = (PcmBitAlignment)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mSigned = (Sign)(long)dVar3;
        dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
        this->mWordSelectInverted = (PcmWordSelectInverted)(long)dVar3;
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,false);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
        bVar2 = true;
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
      }
      else {
        AnalyzerSettings::SetErrorText((char *)this);
        bVar2 = false;
      }
      Channel::~Channel(aCStack_68);
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      bVar2 = false;
    }
    Channel::~Channel(local_58);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
    bVar2 = false;
  }
  Channel::~Channel(local_48);
  return bVar2;
}

Assistant:

bool I2sAnalyzerSettings::SetSettingsFromInterfaces()
{
    Channel clock_channel = mClockChannelInterface->GetChannel();
    if( clock_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM CLOCK signal" );
        return false;
    }

    Channel frame_channel = mFrameChannelInterface->GetChannel();
    if( frame_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM FRAME signal" );
        return false;
    }

    Channel data_channel = mDataChannelInterface->GetChannel();
    if( data_channel == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select a channel for I2S/PCM DATA signal" );
        return false;
    }

    if( ( clock_channel == frame_channel ) || ( clock_channel == data_channel ) || ( frame_channel == data_channel ) )
    {
        SetErrorText( "Please select different channels for the I2S/PCM signals" );
        return false;
    }

    mClockChannel = clock_channel;
    mFrameChannel = frame_channel;
    mDataChannel = data_channel;

    mShiftOrder = AnalyzerEnums::ShiftOrder( U32( mShiftOrderInterface->GetNumber() ) );
    mDataValidEdge = AnalyzerEnums::EdgeDirection( U32( mDataValidEdgeInterface->GetNumber() ) );
    mBitsPerWord = U32( mBitsPerWordInterface->GetNumber() );

    mWordAlignment = PcmWordAlignment( U32( mWordAlignmentInterface->GetNumber() ) );
    mFrameType = PcmFrameType( U32( mFrameTypeInterface->GetNumber() ) );
    mBitAlignment = PcmBitAlignment( U32( mBitAlignmentInterface->GetNumber() ) );

    mSigned = AnalyzerEnums::Sign( U32( mSignedInterface->GetNumber() ) );

    mWordSelectInverted = PcmWordSelectInverted( U32( mWordSelectInvertedInterface->GetNumber() ) );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    return true;
}